

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::D_formatter<spdlog::details::null_scoped_padder>::format
          (D_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  size_t sVar1;
  uint uVar2;
  ulong uVar3;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  ulong local_68 [3];
  buffer<char> local_50;
  memory_buf_t *local_30;
  
  uVar2 = tm_time->tm_mon + 1;
  if (uVar2 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
  }
  else {
    local_68[0] = (ulong)uVar2;
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001d5938;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_68;
    args.desc_ = 1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt,args,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar1 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar1 + 1;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  uVar2 = tm_time->tm_mday;
  uVar3 = (ulong)uVar2;
  if (uVar3 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar3 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
  }
  else {
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001d5938;
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_68;
    args_00.desc_ = 1;
    local_68[0] = uVar3;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt_00,args_00,(locale_ref)0x0);
  }
  if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
  }
  sVar1 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar1 + 1;
  (dest->super_buffer<char>).ptr_[sVar1] = '/';
  uVar2 = tm_time->tm_year % 100;
  if (uVar2 < 100) {
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (byte)(uVar2 / 10) | 0x30;
    if ((dest->super_buffer<char>).capacity_ < (dest->super_buffer<char>).size_ + 1) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    }
    sVar1 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar1 + 1;
    (dest->super_buffer<char>).ptr_[sVar1] = (char)uVar2 + (char)(uVar2 / 10) * -10 | 0x30;
  }
  else {
    local_68[0] = (ulong)uVar2;
    local_50.size_ = (dest->super_buffer<char>).size_;
    local_50._vptr_buffer = (_func_int **)&PTR_grow_001d5938;
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_68;
    args_01.desc_ = 1;
    local_50.capacity_ = local_50.size_;
    local_30 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_50,fmt_01,args_01,(locale_ref)0x0);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_mon + 1, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_mday, dest);
        dest.push_back('/');
        fmt_helper::pad2(tm_time.tm_year % 100, dest);
    }